

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_ether_linktype(compiler_state_t *cstate,int proto)

{
  slist *psVar1;
  block *pbVar2;
  block *pbVar3;
  slist *s;
  block *b;
  u_char local_38 [8];
  
  if (proto < 0xfe) {
    if (proto != 6) {
      if (proto == 0xe0) {
        psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,0,0x10);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x15;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 0xe0;
        psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,0,8);
        pbVar3 = (block *)newchunk(cstate,0x120);
        (pbVar3->s).code = 0x15;
        pbVar3->head = pbVar3;
        pbVar3->stmts = psVar1;
        (pbVar3->s).k = 0xffff;
        gen_or(pbVar2,pbVar3);
        local_38[0] = 0xaa;
        local_38[1] = 0xaa;
        local_38[2] = '\x03';
        local_38[3] = '\0';
        local_38[4] = '\0';
        local_38[5] = '\0';
        local_38[6] = 0x81;
        local_38[7] = '7';
        pbVar2 = gen_bcmp(cstate,OR_LLC,0,8,local_38);
        gen_or(pbVar2,pbVar3);
        psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x25;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 0x5dc;
        pbVar2->sense = (uint)(pbVar2->sense == 0);
        gen_and(pbVar2,pbVar3);
        psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
        pbVar2 = (block *)newchunk(cstate,0x120);
        (pbVar2->s).code = 0x15;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 0x8137;
        goto LAB_00111a08;
      }
      if (proto != 0xf0) goto LAB_00111647;
    }
  }
  else {
    if ((proto == 0x80f3) || (proto == 0x809b)) {
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x25;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      (pbVar2->s).k = 0x5dc;
      pbVar2->sense = (uint)(pbVar2->sense == 0);
      if (proto == 0x809b) {
        local_38[0] = 0xaa;
        local_38[1] = 0xaa;
        local_38[2] = '\x03';
        local_38[3] = '\b';
        local_38[4] = '\0';
        local_38[5] = '\a';
        local_38[6] = 0x80;
        local_38[7] = 0x9b;
        pbVar3 = gen_bcmp(cstate,OR_LLC,0,8,local_38);
        proto = 0x809b;
      }
      else {
        local_38[0] = 0xaa;
        local_38[1] = 0xaa;
        local_38[2] = '\x03';
        local_38[3] = '\0';
        local_38[4] = '\0';
        local_38[5] = '\0';
        local_38[6] = 0x80;
        local_38[7] = 0xf3;
        pbVar3 = gen_bcmp(cstate,OR_LLC,0,8,local_38);
      }
      gen_and(pbVar2,pbVar3);
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar2 = (block *)newchunk(cstate,0x120);
      (pbVar2->s).code = 0x15;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      (pbVar2->s).k = proto;
LAB_00111a08:
      gen_or(pbVar2,pbVar3);
      return pbVar3;
    }
    if (proto != 0xfe) {
LAB_00111647:
      psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar2 = (block *)newchunk(cstate,0x120);
      if (proto < 0x5dd) {
        (pbVar2->s).code = 0x25;
        pbVar2->head = pbVar2;
        pbVar2->stmts = psVar1;
        (pbVar2->s).k = 0x5dc;
        pbVar2->sense = (uint)(pbVar2->sense == 0);
        psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,2,0x10);
        pbVar3 = (block *)newchunk(cstate,0x120);
        (pbVar3->s).code = 0x15;
        pbVar3->head = pbVar3;
        pbVar3->stmts = psVar1;
        (pbVar3->s).k = proto;
        gen_and(pbVar2,pbVar3);
        return pbVar3;
      }
      (pbVar2->s).code = 0x15;
      pbVar2->head = pbVar2;
      pbVar2->stmts = psVar1;
      (pbVar2->s).k = proto;
      return pbVar2;
    }
  }
  psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
  pbVar2 = (block *)newchunk(cstate,0x120);
  (pbVar2->s).code = 0x25;
  pbVar2->head = pbVar2;
  pbVar2->stmts = psVar1;
  (pbVar2->s).k = 0x5dc;
  pbVar2->sense = (uint)(pbVar2->sense == 0);
  psVar1 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,0,8);
  pbVar3 = (block *)newchunk(cstate,0x120);
  (pbVar3->s).code = 0x15;
  pbVar3->head = pbVar3;
  pbVar3->stmts = psVar1;
  (pbVar3->s).k = proto << 8 | proto;
  gen_and(pbVar2,pbVar3);
  return pbVar3;
}

Assistant:

static struct block *
gen_ether_linktype(compiler_state_t *cstate, int proto)
{
	struct block *b0, *b1;

	switch (proto) {

	case LLCSAP_ISONS:
	case LLCSAP_IP:
	case LLCSAP_NETBEUI:
		/*
		 * OSI protocols and NetBEUI always use 802.2 encapsulation,
		 * so we check the DSAP and SSAP.
		 *
		 * LLCSAP_IP checks for IP-over-802.2, rather
		 * than IP-over-Ethernet or IP-over-SNAP.
		 *
		 * XXX - should we check both the DSAP and the
		 * SSAP, like this, or should we check just the
		 * DSAP, as we do for other types <= ETHERMTU
		 * (i.e., other SAP values)?
		 */
		b0 = gen_cmp_gt(cstate, OR_LINKTYPE, 0, BPF_H, ETHERMTU);
		gen_not(b0);
		b1 = gen_cmp(cstate, OR_LLC, 0, BPF_H, (bpf_int32)
			     ((proto << 8) | proto));
		gen_and(b0, b1);
		return b1;

	case LLCSAP_IPX:
		/*
		 * Check for;
		 *
		 *	Ethernet_II frames, which are Ethernet
		 *	frames with a frame type of ETHERTYPE_IPX;
		 *
		 *	Ethernet_802.3 frames, which are 802.3
		 *	frames (i.e., the type/length field is
		 *	a length field, <= ETHERMTU, rather than
		 *	a type field) with the first two bytes
		 *	after the Ethernet/802.3 header being
		 *	0xFFFF;
		 *
		 *	Ethernet_802.2 frames, which are 802.3
		 *	frames with an 802.2 LLC header and
		 *	with the IPX LSAP as the DSAP in the LLC
		 *	header;
		 *
		 *	Ethernet_SNAP frames, which are 802.3
		 *	frames with an LLC header and a SNAP
		 *	header and with an OUI of 0x000000
		 *	(encapsulated Ethernet) and a protocol
		 *	ID of ETHERTYPE_IPX in the SNAP header.
		 *
		 * XXX - should we generate the same code both
		 * for tests for LLCSAP_IPX and for ETHERTYPE_IPX?
		 */

		/*
		 * This generates code to check both for the
		 * IPX LSAP (Ethernet_802.2) and for Ethernet_802.3.
		 */
		b0 = gen_cmp(cstate, OR_LLC, 0, BPF_B, (bpf_int32)LLCSAP_IPX);
		b1 = gen_cmp(cstate, OR_LLC, 0, BPF_H, (bpf_int32)0xFFFF);
		gen_or(b0, b1);

		/*
		 * Now we add code to check for SNAP frames with
		 * ETHERTYPE_IPX, i.e. Ethernet_SNAP.
		 */
		b0 = gen_snap(cstate, 0x000000, ETHERTYPE_IPX);
		gen_or(b0, b1);

		/*
		 * Now we generate code to check for 802.3
		 * frames in general.
		 */
		b0 = gen_cmp_gt(cstate, OR_LINKTYPE, 0, BPF_H, ETHERMTU);
		gen_not(b0);

		/*
		 * Now add the check for 802.3 frames before the
		 * check for Ethernet_802.2 and Ethernet_802.3,
		 * as those checks should only be done on 802.3
		 * frames, not on Ethernet frames.
		 */
		gen_and(b0, b1);

		/*
		 * Now add the check for Ethernet_II frames, and
		 * do that before checking for the other frame
		 * types.
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, (bpf_int32)ETHERTYPE_IPX);
		gen_or(b0, b1);
		return b1;

	case ETHERTYPE_ATALK:
	case ETHERTYPE_AARP:
		/*
		 * EtherTalk (AppleTalk protocols on Ethernet link
		 * layer) may use 802.2 encapsulation.
		 */

		/*
		 * Check for 802.2 encapsulation (EtherTalk phase 2?);
		 * we check for an Ethernet type field less than
		 * 1500, which means it's an 802.3 length field.
		 */
		b0 = gen_cmp_gt(cstate, OR_LINKTYPE, 0, BPF_H, ETHERMTU);
		gen_not(b0);

		/*
		 * 802.2-encapsulated ETHERTYPE_ATALK packets are
		 * SNAP packets with an organization code of
		 * 0x080007 (Apple, for Appletalk) and a protocol
		 * type of ETHERTYPE_ATALK (Appletalk).
		 *
		 * 802.2-encapsulated ETHERTYPE_AARP packets are
		 * SNAP packets with an organization code of
		 * 0x000000 (encapsulated Ethernet) and a protocol
		 * type of ETHERTYPE_AARP (Appletalk ARP).
		 */
		if (proto == ETHERTYPE_ATALK)
			b1 = gen_snap(cstate, 0x080007, ETHERTYPE_ATALK);
		else	/* proto == ETHERTYPE_AARP */
			b1 = gen_snap(cstate, 0x000000, ETHERTYPE_AARP);
		gen_and(b0, b1);

		/*
		 * Check for Ethernet encapsulation (Ethertalk
		 * phase 1?); we just check for the Ethernet
		 * protocol type.
		 */
		b0 = gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H, (bpf_int32)proto);

		gen_or(b0, b1);
		return b1;

	default:
		if (proto <= ETHERMTU) {
			/*
			 * This is an LLC SAP value, so the frames
			 * that match would be 802.2 frames.
			 * Check that the frame is an 802.2 frame
			 * (i.e., that the length/type field is
			 * a length field, <= ETHERMTU) and
			 * then check the DSAP.
			 */
			b0 = gen_cmp_gt(cstate, OR_LINKTYPE, 0, BPF_H, ETHERMTU);
			gen_not(b0);
			b1 = gen_cmp(cstate, OR_LINKTYPE, 2, BPF_B, (bpf_int32)proto);
			gen_and(b0, b1);
			return b1;
		} else {
			/*
			 * This is an Ethernet type, so compare
			 * the length/type field with it (if
			 * the frame is an 802.2 frame, the length
			 * field will be <= ETHERMTU, and, as
			 * "proto" is > ETHERMTU, this test
			 * will fail and the frame won't match,
			 * which is what we want).
			 */
			return gen_cmp(cstate, OR_LINKTYPE, 0, BPF_H,
			    (bpf_int32)proto);
		}
	}
}